

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemoryRegionSection * iotlb_to_section_mips(CPUState *cpu,hwaddr index,MemTxAttrs attrs)

{
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var1;
  MemTxAttrs in_EAX;
  uint uVar2;
  
  p_Var1 = cpu->cc->asidx_from_attrs;
  if (p_Var1 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (*p_Var1)((CPUState_conflict *)cpu,in_EAX);
    if (((int)uVar2 < 0) || (cpu->num_ases <= (int)uVar2)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  return (MemoryRegionSection *)
         ((long)&(((cpu->cpu_ases[uVar2].memory_dispatch)->map).sections)->size +
         (ulong)(((uint)index & 0xfff) << 6));
}

Assistant:

MemoryRegionSection *iotlb_to_section(CPUState *cpu,
                                      hwaddr index, MemTxAttrs attrs)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    CPUAddressSpace *cpuas = &cpu->cpu_ases[asidx];
    AddressSpaceDispatch *d = cpuas->memory_dispatch;
    MemoryRegionSection *sections = d->map.sections;

    return &sections[index & ~TARGET_PAGE_MASK];
}